

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O2

int __thiscall QTabBar::insertTab(QTabBar *this,int index,QIcon *icon,QString *text)

{
  long lVar1;
  QTabBarPrivate *this_00;
  Tab **ppTVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  ButtonPosition position;
  Tab *pTVar6;
  QStyle *pQVar7;
  QWidget *widget;
  int iVar8;
  long lVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  QRect QVar11;
  undefined1 local_e0 [8];
  QStyleOptionTab opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTabBarPrivate **)&(this->super_QWidget).field_0x8;
  if (index < 0) {
    uVar10 = (this_00->tabList).d.size;
  }
  else {
    uVar10 = (this_00->tabList).d.size;
    if ((uint)index < uVar10) {
      pTVar6 = (Tab *)operator_new(0xf0);
      QTabBarPrivate::Tab::Tab(pTVar6,icon,text);
      QList<QTabBarPrivate::Tab_*>::insert(&this_00->tabList,(ulong)(uint)index,pTVar6);
      goto LAB_0044ec26;
    }
  }
  pTVar6 = (Tab *)operator_new(0xf0);
  QTabBarPrivate::Tab::Tab(pTVar6,icon,text);
  QList<QTabBarPrivate::Tab_*>::append(&this_00->tabList,pTVar6);
  index = (int)uVar10;
LAB_0044ec26:
  QKeySequence::mnemonic((QString *)&opt);
  iVar5 = QWidget::grabShortcut(&this->super_QWidget,(QKeySequence *)&opt,WindowShortcut);
  (this_00->tabList).d.ptr[index]->shortcutId = iVar5;
  QKeySequence::~QKeySequence((QKeySequence *)&opt);
  iVar5 = this_00->firstVisible;
  if (index < this_00->firstVisible) {
    iVar5 = index;
  }
  iVar8 = 0;
  if (0 < iVar5) {
    iVar8 = iVar5;
  }
  this_00->firstVisible = iVar8;
  QTabBarPrivate::refresh(this_00);
  if ((this_00->tabList).d.size == 1) {
    setCurrentIndex(this,index);
  }
  else if (index <= this_00->currentIndex) {
    this_00->currentIndex = this_00->currentIndex + 1;
  }
  iVar5 = this_00->lastVisible + 1;
  if (this_00->lastVisible < index) {
    iVar5 = index;
  }
  this_00->lastVisible = iVar5;
  if ((this_00->field_0x2d0 & 0x40) != 0) {
    memset(&opt,0xaa,0xa0);
    QStyleOptionTab::QStyleOptionTab(&opt);
    (**(code **)(*(long *)&this->super_QWidget + 0x1c8))(this,&opt,index);
    pQVar7 = QWidget::style(&this->super_QWidget);
    position = (**(code **)(*(long *)pQVar7 + 0xf0))(pQVar7,0x5c,0,this,0);
    widget = (QWidget *)operator_new(0x28);
    anon_unknown.dwarf_fc801a::CloseButton::CloseButton((CloseButton *)widget,&this->super_QWidget);
    QObjectPrivate::connect<void(QAbstractButton::*)(bool),void(QTabBarPrivate::*)()>
              ((Object *)local_e0,(offset_in_QAbstractButton_to_subr)widget,
               (Object *)QAbstractButton::clicked,0,(ConnectionType)this_00);
    QMetaObject::Connection::~Connection((Connection *)local_e0);
    setTabButton(this,index,position,widget);
    QStyleOptionTab::~QStyleOptionTab(&opt);
  }
  ppTVar2 = (this_00->tabList).d.ptr;
  lVar3 = (this_00->tabList).d.size;
  for (lVar9 = 0; lVar3 << 3 != lVar9; lVar9 = lVar9 + 8) {
    lVar4 = *(long *)((long)ppTVar2 + lVar9);
    iVar5 = *(int *)(lVar4 + 0xdc);
    if (index <= iVar5) {
      *(int *)(lVar4 + 0xdc) = iVar5 + 1;
    }
  }
  iVar5 = tabAt(this,&this_00->mousePosition);
  if (iVar5 == index) {
    this_00->hoverIndex = index;
    QVar11 = tabRect(this,index);
    *(QRect *)&(this_00->super_QWidgetPrivate).field_0x254 = QVar11;
  }
  (**(code **)(*(long *)&this->super_QWidget + 0x1b0))(this,index);
  QTabBarPrivate::autoHideTabs(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return index;
  }
  __stack_chk_fail();
}

Assistant:

int QTabBar::insertTab(int index, const QIcon& icon, const QString &text)
{
    Q_D(QTabBar);
    if (!d->validIndex(index)) {
        index = d->tabList.size();
        d->tabList.append(new QTabBarPrivate::Tab(icon, text));
    } else {
        d->tabList.insert(index, new QTabBarPrivate::Tab(icon, text));
    }
#ifndef QT_NO_SHORTCUT
    d->tabList.at(index)->shortcutId = grabShortcut(QKeySequence::mnemonic(text));
#endif
    d->firstVisible = qMax(qMin(index, d->firstVisible), 0);
    d->refresh();
    if (d->tabList.size() == 1)
        setCurrentIndex(index);
    else if (index <= d->currentIndex)
        ++d->currentIndex;

    if (index <= d->lastVisible)
        ++d->lastVisible;
    else
        d->lastVisible = index;

    if (d->closeButtonOnTabs) {
        QStyleOptionTab opt;
        initStyleOption(&opt, index);
        ButtonPosition closeSide = (ButtonPosition)style()->styleHint(QStyle::SH_TabBar_CloseButtonPosition, nullptr, this);
        QAbstractButton *closeButton = new CloseButton(this);
        QObjectPrivate::connect(closeButton, &CloseButton::clicked,
                                d, &QTabBarPrivate::closeTab);
        setTabButton(index, closeSide, closeButton);
    }

    for (const auto tab : std::as_const(d->tabList)) {
        if (tab->lastTab >= index)
            ++tab->lastTab;
    }

    if (tabAt(d->mousePosition) == index) {
        d->hoverIndex = index;
        d->hoverRect = tabRect(index);
    }

    tabInserted(index);
    d->autoHideTabs();
    return index;
}